

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  long lVar1;
  long *plVar2;
  Printer *pPVar3;
  FileDescriptor *pFVar4;
  long lVar5;
  long lVar6;
  string constant_name;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pFVar4 = this->file_;
  if (0 < *(int *)(pFVar4 + 0x78)) {
    lVar6 = 0;
    do {
      lVar1 = *(long *)(pFVar4 + 0x80);
      plVar2 = *(long **)(lVar1 + lVar6 * 0x78);
      local_70 = local_60;
      lVar5 = *plVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,lVar5,plVar2[1] + lVar5);
      std::__cxx11::string::append((char *)&local_70);
      if (local_68 != 0) {
        lVar5 = 0;
        do {
          if ((byte)(*(char *)((long)local_70 + lVar5) + 0x9fU) < 0x1a) {
            *(char *)((long)local_70 + lVar5) = *(char *)((long)local_70 + lVar5) + -0x20;
          }
          lVar5 = lVar5 + 1;
        } while (local_68 != lVar5);
      }
      pPVar3 = this->printer_;
      google::protobuf::SimpleItoa_abi_cxx11_((int)local_50);
      google::protobuf::io::Printer::Print
                ((char *)pPVar3,"$constant_name$ = $number$\n",(string *)"constant_name",
                 (char *)&local_70,(string *)"number");
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      google::protobuf::io::Printer::Print((char *)this->printer_,"$name$ = ",(string *)0x16ded4);
      PrintFieldDescriptor(this,(FieldDescriptor *)(lVar1 + lVar6 * 0x78),true);
      google::protobuf::io::Printer::Print((char *)this->printer_);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
    } while (lVar6 < *(int *)(pFVar4 + 0x78));
  }
  google::protobuf::io::Printer::Print((char *)this->printer_);
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  const bool is_extension = true;
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    string constant_name = extension_field.name() + "_FIELD_NUMBER";
    UpperString(&constant_name);
    printer_->Print("$constant_name$ = $number$\n",
      "constant_name", constant_name,
      "number", SimpleItoa(extension_field.number()));
    printer_->Print("$name$ = ", "name", extension_field.name());
    PrintFieldDescriptor(extension_field, is_extension);
    printer_->Print("\n");
  }
  printer_->Print("\n");
}